

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O2

void * __thiscall
JetHead::File::mmap(File *this,void *__addr,size_t __len,int __prot,int __flags,int __fd,
                   __off_t __offset)

{
  size_t __len_00;
  uint8_t *puVar1;
  int __prot_00;
  
  __len_00 = getLength(this);
  __prot_00 = 3;
  if ((~this->mOpenFlags & 3U) != 0) {
    __prot_00 = 2 - (uint)((this->mOpenFlags & 2U) == 0);
  }
  puVar1 = (uint8_t *)::mmap((void *)0x0,__len_00,__prot_00,1,this->mFd,0);
  if (puVar1 == (uint8_t *)0xffffffffffffffff) {
    setError(this);
    puVar1 = (uint8_t *)0x0;
  }
  else {
    this->mMapAddress = puVar1;
    this->mMapLength = __len_00;
  }
  return puVar1;
}

Assistant:

uint8_t *File::mmap()
{
	int prot = PROT_READ;
	size_t length = getLength();

	if ( ( mOpenFlags & OF_RDWR ) == OF_RDWR )
		prot |= PROT_WRITE;
	else if ( mOpenFlags & OF_WRITE )
		prot = PROT_WRITE;

	uint8_t *addr = (uint8_t*)::mmap( NULL, length, prot, MAP_SHARED, mFd, 0 );

	if ( addr != MAP_FAILED )
	{
		mMapAddress = addr;
		mMapLength = length;
	}
	else
	{
		setError();
		addr = NULL;
	}

	return addr;
}